

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.cpp
# Opt level: O3

void stack_init(lua_State *L1,lua_State *L)

{
  StkId pTVar1;
  CallInfo *pCVar2;
  StkId pTVar3;
  
  pCVar2 = (CallInfo *)luaM_realloc_(L,(void *)0x0,0,0x140);
  L1->base_ci = pCVar2;
  L1->ci = pCVar2;
  L1->size_ci = 8;
  L1->end_ci = pCVar2 + 7;
  pTVar3 = (StkId)luaM_realloc_(L,(void *)0x0,0,0x2d0);
  L1->stack = pTVar3;
  L1->stacksize = 0x2d;
  L1->stack_last = pTVar3 + 0x27;
  pCVar2 = L1->ci;
  pCVar2->func = pTVar3;
  pTVar1 = pTVar3 + 1;
  L1->top = pTVar1;
  pTVar3->tt = 0;
  pCVar2->base = pTVar1;
  L1->base = pTVar1;
  pCVar2->top = pTVar3 + 0x15;
  return;
}

Assistant:

static void stack_init (lua_State *L1, lua_State *L) {
  /* initialize CallInfo array */
  L1->base_ci = luaM_newvector(L, BASIC_CI_SIZE, CallInfo);
  L1->ci = L1->base_ci;
  L1->size_ci = BASIC_CI_SIZE;
  L1->end_ci = L1->base_ci + L1->size_ci - 1;
  /* initialize stack array */
  L1->stack = luaM_newvector(L, BASIC_STACK_SIZE + EXTRA_STACK, TValue);
  L1->stacksize = BASIC_STACK_SIZE + EXTRA_STACK;
  L1->top = L1->stack;
  L1->stack_last = L1->stack+(L1->stacksize - EXTRA_STACK)-1;
  /* initialize first ci */
  L1->ci->func = L1->top;
  setnilvalue(L1->top++);  /* `function' entry for this `ci' */
  L1->base = L1->ci->base = L1->top;
  L1->ci->top = L1->top + LUA_MINSTACK;
}